

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O2

int CFITS2Unit(fitsfile *fptr)

{
  long lVar1;
  int status;
  
  status = 0;
  lVar1 = (long)CFITS2Unit::last_unit;
  if ((lVar1 == 0) || (gFitsFiles[lVar1] != fptr)) {
    for (lVar1 = 1; CFITS2Unit::last_fptr = fptr, lVar1 != 10000; lVar1 = lVar1 + 1) {
      if (gFitsFiles[lVar1] == fptr) {
        CFITS2Unit::last_unit = (int)lVar1;
        goto LAB_0015559c;
      }
    }
    CFITS2Unit::last_unit = 10000;
    Cffgiou(&CFITS2Unit::last_unit,&status);
    if (status == 0) {
      lVar1 = (long)CFITS2Unit::last_unit;
      gFitsFiles[lVar1] = fptr;
    }
    else {
      CFITS2Unit::last_unit = 0;
      lVar1 = 0;
    }
  }
LAB_0015559c:
  return (int)lVar1;
}

Assistant:

int CFITS2Unit( fitsfile *fptr )
     /* Utility routine to convert a fitspointer to a Fortran unit number */
     /* for use when a C program is calling a Fortran routine which could */
     /* in turn call CFITSIO... Modelled after code by Ning Gan.          */
{
   static fitsfile *last_fptr = (fitsfile *)NULL; /* Remember last fptr */
   static int last_unit = 0;                      /* Remember last unit */
   int status = 0;

   /*  Test whether we are repeating the last lookup  */

   if( last_unit && fptr==gFitsFiles[last_unit] )
      return( last_unit );

   /*  Check if gFitsFiles has an entry for this fptr.  */
   /*  Allows Fortran to call C to call Fortran to      */
   /*  call CFITSIO... OUCH!!!                          */

   last_fptr = fptr;
   for( last_unit=1; last_unit<NMAXFILES; last_unit++ ) {
      if( fptr == gFitsFiles[last_unit] )
	 return( last_unit );
   }

   /*  Allocate a new unit number for this fptr  */
   Cffgiou( &last_unit, &status );
   if( status )
      last_unit = 0;
   else
      gFitsFiles[last_unit] = fptr;
   return( last_unit );
}